

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_flow_event_e fhndl_send(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  __suseconds_t *p_Var1;
  uint uVar2;
  pcp_errno pVar3;
  pcp_server_t *s;
  pcp_flow_event_e pVar4;
  
  s = get_pcp_server(f->ctx,f->pcp_server_indx);
  pVar4 = fev_failed;
  if (s != (pcp_server_t *)0x0) {
    if (s->restart_flow_msg == f) {
      pVar4 = fev_ignored;
    }
    else {
      pVar3 = pcp_flow_send_msg(f,s);
      if (pVar3 == PCP_ERR_SUCCESS) {
        f->resend_timeout = 3000;
        gettimeofday((timeval *)&f->timeout,(__timezone_ptr_t)0x0);
        uVar2 = f->resend_timeout;
        (f->timeout).tv_sec = (f->timeout).tv_sec + (ulong)uVar2 / 1000;
        p_Var1 = &(f->timeout).tv_usec;
        *p_Var1 = *p_Var1 + (ulong)((uVar2 % 1000) * 1000);
        pVar4 = fev_msg_sent;
      }
    }
  }
  return pVar4;
}

Assistant:

static pcp_flow_event_e fhndl_send(pcp_flow_t *f, UNUSED pcp_recv_msg_t *msg) {
    pcp_server_t *s = get_pcp_server(f->ctx, f->pcp_server_indx);
    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!s) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return fev_failed;
    }

    if (s->restart_flow_msg == f) {
        return fev_ignored;
    }

    if (pcp_flow_send_msg(f, s) != PCP_ERR_SUCCESS) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return fev_failed;
    }

    f->resend_timeout = PCP_RETX_IRT;
    // set timeout field
    gettimeofday(&f->timeout, NULL);
    f->timeout.tv_sec += f->resend_timeout / 1000;
    f->timeout.tv_usec += (f->resend_timeout % 1000) * 1000;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return fev_msg_sent;
}